

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseAttrMeta(AsciiParser *this,AttrMeta *out_meta)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *this_00;
  optional<tinyusdz::Token> *poVar1;
  StreamReader *pSVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  value_type *def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar10;
  char *pcVar11;
  optional<tinyusdz::Token> *this_01;
  optional<std::__cxx11::string> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_2ea;
  char c_1;
  string varname;
  string name_err;
  char c;
  undefined7 uStack_1e7;
  uint32_t uStack_1e4;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c0 [21];
  allocator local_70 [32];
  uint32_t value_1;
  undefined4 uStack_4c;
  
  bVar3 = SkipWhitespace(this);
  if (bVar3) {
    bVar3 = Char1(this,&c);
    if (!bVar3) {
      return bVar3;
    }
    if (c != '(') {
      pSVar2 = this->_sr;
      if ((long)pSVar2->idx_ < 1) {
        return bVar3;
      }
      uVar10 = pSVar2->idx_ - 1;
      if (uVar10 <= pSVar2->length_) {
        pSVar2->idx_ = uVar10;
        return bVar3;
      }
      return bVar3;
    }
    bVar3 = SkipWhitespaceAndNewline(this,true);
    if (bVar3) {
      this_00 = &out_meta->meta;
      poVar1 = &out_meta->bindMaterialAs;
      while( true ) {
        bVar3 = Eof(this);
        if (bVar3) {
          return bVar3;
        }
        bVar4 = Char1(this,&c_1);
        if (!bVar4) break;
        if (c_1 == ')') {
          return true;
        }
        bVar4 = Rewind(this,1);
        if (!bVar4) {
          return false;
        }
        _c = local_1d8;
        local_1e0 = (undefined1  [8])0x0;
        local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
        local_1d8[0x10] = false;
        local_1d8[0x11] = false;
        local_1d8._20_4_ = 0;
        aaStack_1c0[0]._M_allocated_capacity._0_4_ = 0;
        bVar4 = MaybeTripleQuotedString(this,(StringData *)&c);
        if ((bVar4) || (bVar4 = MaybeString(this,(StringData *)&c), bVar4)) {
          ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
          push_back(&out_meta->stringData,(StringData *)&c);
          bVar4 = SkipWhitespaceAndNewline(this,true);
          cVar5 = bVar4 + '\x01';
          bVar4 = false;
        }
        else {
          cVar5 = '\0';
          bVar4 = true;
        }
        ::std::__cxx11::string::_M_dispose();
        if (bVar4) {
          varname._M_dataplus._M_p = (pointer)&varname.field_2;
          varname._M_string_length = 0;
          varname.field_2._M_local_buf[0] = '\0';
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&varname;
          bVar4 = ReadIdentifier(this,&varname);
          cVar5 = true;
          if (bVar4) {
            sVar7 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
                    ::count(&this->_supported_prop_metas,(key_type *)&varname);
            if (sVar7 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
              poVar9 = ::std::operator<<((ostream *)&c,"[error]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,"[ASCII]");
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xce0);
              ::std::operator<<(poVar9," ");
              ::std::__cxx11::string::string
                        ((string *)&value_1,"Unsupported Property metadatum name: {}",local_70);
              fmt::format<std::__cxx11::string>
                        ((string *)&name_err,(fmt *)&value_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &varname,args);
              poVar9 = ::std::operator<<((ostream *)&c,(string *)&name_err);
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              PushError(this,&name_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
LAB_00297903:
              cVar5 = true;
            }
            else {
              name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
              name_err._M_string_length = 0;
              name_err.field_2._M_local_buf[0] = '\0';
              ::std::__cxx11::string::string((string *)&value_1,"",local_70);
              Path::Path((Path *)&c,(string *)&value_1,&varname);
              bVar4 = pathutil::ValidatePropPath((Path *)&c,&name_err);
              Path::~Path((Path *)&c);
              ::std::__cxx11::string::_M_dispose();
              if (bVar4) {
                ::std::__cxx11::string::_M_dispose();
                cVar5 = true;
                bVar4 = SkipWhitespaceAndNewline(this,true);
                if (bVar4) {
                  bVar4 = Expect(this,'=');
                  cVar5 = true;
                  if ((bVar4) && (bVar4 = SkipWhitespaceAndNewline(this,true), bVar4)) {
                    bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&varname,"interpolation");
                    if (bVar4) {
                      _c = local_1d8;
                      local_1e0 = (undefined1  [8])0x0;
                      local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
                      bVar4 = ReadStringLiteral(this,(string *)&c);
                      if (!bVar4) {
                        ::std::__cxx11::string::_M_dispose();
                        goto LAB_00297c72;
                      }
                      InterpolationFromString
                                ((optional<tinyusdz::Interpolation> *)&name_err,(string *)&c);
                      nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
                                (&out_meta->interpolation,
                                 (optional<tinyusdz::Interpolation> *)&name_err);
                      ::std::__cxx11::string::_M_dispose();
                    }
                    else {
                      bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&varname,"elementSize");
                      if (bVar4) {
                        bVar4 = ReadBasicType(this,&value_1);
                        if (!bVar4) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                          poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                          poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                          poVar9 = ::std::operator<<(poVar9,":");
                          poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                          poVar9 = ::std::operator<<(poVar9,"():");
                          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd06);
                          ::std::operator<<(poVar9," ");
                          pcVar11 = "Failed to parse `elementSize`";
LAB_00297c2e:
                          poVar9 = ::std::operator<<((ostream *)&c,pcVar11);
                          ::std::operator<<(poVar9,"\n");
                          ::std::__cxx11::stringbuf::str();
                          PushError(this,&name_err);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
                          goto LAB_00297c72;
                        }
                        c = 1;
                        uStack_1e4 = value_1;
                        nonstd::optional_lite::optional<unsigned_int>::operator=
                                  (&out_meta->elementSize,(optional<unsigned_int> *)&c);
                      }
                      else {
                        bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"colorSpace");
                        if (bVar4) {
                          name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                          name_err._M_string_length = 0;
                          name_err.field_2._M_local_buf[0] = '\0';
                          bVar4 = ReadBasicType(this,(token *)&name_err);
                          if (bVar4) {
                            local_1d8._0_8_ =
                                 &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                            _c = (pointer)0x0;
                            local_1d8._8_8_ = aaStack_1c0;
                            local_1d8[0x10] = false;
                            local_1d8[0x11] = false;
                            local_1d8._18_2_ = 0;
                            local_1d8._20_4_ = 0;
                            aaStack_1c0[0]._M_allocated_capacity._0_4_ =
                                 (undefined4)aaStack_1c0[0]._M_allocated_capacity & 0xffffff00;
                            ::std::__cxx11::string::string((string *)&value_1,"colorSpace",local_70)
                            ;
                            MetaVariable::set_value<tinyusdz::Token>
                                      ((MetaVariable *)&c,(string *)&value_1,(Token *)&name_err);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::string((string *)&value_1,"colorSpace",local_70)
                            ;
                            pmVar8 = ::std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                     ::operator[](this_00,(string *)&value_1);
                            MetaVariable::operator=(pmVar8,(MetaVariable *)&c);
                            ::std::__cxx11::string::_M_dispose();
                            MetaVariable::~MetaVariable((MetaVariable *)&c);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                            poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                            poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                            poVar9 = ::std::operator<<(poVar9,":");
                            poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                            poVar9 = ::std::operator<<(poVar9,"():");
                            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd0e);
                            ::std::operator<<(poVar9," ");
                            poVar9 = ::std::operator<<((ostream *)&c,"Failed to parse `colorSpace`")
                            ;
                            ::std::operator<<(poVar9,"\n");
                            ::std::__cxx11::stringbuf::str();
                            PushError(this,(string *)&value_1);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
                          }
LAB_00297e15:
                          ::std::__cxx11::string::_M_dispose();
                          cVar5 = true;
                          if (bVar4 == false) goto LAB_00297a1f;
                        }
                        else {
                          bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"unauthoredValuesIndex");
                          if (bVar4) {
                            bVar4 = ReadBasicType(this,(int *)&value_1);
                            if (!bVar4) {
                              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                              poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                              poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                              poVar9 = ::std::operator<<(poVar9,":");
                              poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                              poVar9 = ::std::operator<<(poVar9,"():");
                              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd17);
                              ::std::operator<<(poVar9," ");
                              pcVar11 = "Failed to parse `unauthoredValuesIndex`";
                              goto LAB_00297c2e;
                            }
                            local_1d8._0_8_ =
                                 &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                            _c = (pointer)0x0;
                            local_1d8._8_8_ = aaStack_1c0;
                            local_1d8[0x10] = false;
                            local_1d8[0x11] = false;
                            local_1d8._18_2_ = 0;
                            local_1d8._20_4_ = 0;
                            aaStack_1c0[0]._M_allocated_capacity._0_4_ =
                                 (undefined4)aaStack_1c0[0]._M_allocated_capacity & 0xffffff00;
                            ::std::__cxx11::string::string
                                      ((string *)&name_err,"unauthoredValuesIndex",local_70);
                            MetaVariable::set_value<int>
                                      ((MetaVariable *)&c,&name_err,(int *)&value_1);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::string
                                      ((string *)&name_err,"unauthoredValuesIndex",local_70);
                            pmVar8 = ::std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                     ::operator[](this_00,&name_err);
                            MetaVariable::operator=(pmVar8,(MetaVariable *)&c);
                            ::std::__cxx11::string::_M_dispose();
                            MetaVariable::~MetaVariable((MetaVariable *)&c);
                          }
                          else {
                            bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"customData");
                            if (bVar4) {
                              local_1e0 = (undefined1  [8])((ulong)local_1e0 & 0xffffffff00000000);
                              local_1d8._0_8_ = (undefined **)0x0;
                              local_1d8._8_8_ = local_1e0;
                              local_1d8._16_2_ = (undefined2)local_1d8._8_8_;
                              local_1d8._18_2_ = (undefined2)((ulong)local_1d8._8_8_ >> 0x10);
                              local_1d8._20_4_ = (undefined4)((ulong)local_1d8._8_8_ >> 0x20);
                              aaStack_1c0[0]._M_allocated_capacity._0_4_ = 0;
                              aaStack_1c0[0]._M_allocated_capacity._4_4_ = 0;
                              bVar4 = ParseDict(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)&c);
                              if (!bVar4) {
                                ::std::
                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                             *)&c);
                                goto LAB_00297903;
                              }
                              nonstd::optional_lite::
                              optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                              ::operator=((optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                           *)&out_meta->customData,
                                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                           *)&c);
                              ::std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                           *)&c);
                            }
                            else {
                              bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"weight");
                              if (!bVar4) {
                                bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"bindMaterialAs");
                                if (bVar4) {
                                  name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                                  name_err._M_string_length = 0;
                                  name_err.field_2._M_local_buf[0] = '\0';
                                  bVar4 = ReadBasicType(this,(token *)&name_err);
                                  if (bVar4) {
                                    bVar6 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&name_err,"weakerThanDescendants");
                                    this_01 = poVar1;
                                    if ((!bVar6) &&
                                       (bVar6 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&name_err,"strongerThanDescendants"), !bVar6)) {
                                      ::std::__cxx11::ostringstream::ostringstream
                                                ((ostringstream *)&c);
                                      poVar9 = ::std::operator<<((ostream *)&c,"[warn]");
                                      poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                      poVar9 = ::std::operator<<(poVar9,":");
                                      poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                      poVar9 = ::std::operator<<(poVar9,"():");
                                      poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd3a);
                                      ::std::operator<<(poVar9," ");
                                      poVar9 = ::std::operator<<((ostream *)&c,
                                                                                                                                  
                                                  "Unsupported token for bindMaterialAs: ");
                                      poVar9 = ::std::operator<<(poVar9,(string *)&name_err);
                                      ::std::operator<<(poVar9,"\n");
                                      ::std::__cxx11::stringbuf::str();
                                      PushWarn(this,(string *)&value_1);
                                      ::std::__cxx11::string::_M_dispose();
                                      ::std::__cxx11::ostringstream::~ostringstream
                                                ((ostringstream *)&c);
                                    }
                                    goto LAB_002980e7;
                                  }
                                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                                  poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                  poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                  poVar9 = ::std::operator<<(poVar9,":");
                                  poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                  poVar9 = ::std::operator<<(poVar9,"():");
                                  poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd33);
                                  ::std::operator<<(poVar9," ");
                                  pcVar11 = "Failed to parse `bindMaterialAs`";
                                }
                                else {
                                  bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"displayName");
                                  if (bVar4) {
                                    name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                                    name_err._M_string_length = 0;
                                    name_err.field_2._M_local_buf[0] = '\0';
                                    bVar4 = ReadStringLiteral(this,&name_err);
                                    this_02 = (optional<std::__cxx11::string> *)
                                              &out_meta->displayName;
                                    if (bVar4) {
LAB_002982ee:
                                      nonstd::optional_lite::optional<std::__cxx11::string>::
                                      operator=(this_02,&name_err);
                                      goto LAB_00297e15;
                                    }
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&c);
                                    poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                    poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                    poVar9 = ::std::operator<<(poVar9,":");
                                    poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                    poVar9 = ::std::operator<<(poVar9,"():");
                                    poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd41);
                                    ::std::operator<<(poVar9," ");
                                    pcVar11 = "Failed to parse `displayName`(string type)";
                                  }
                                  else {
                                    bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"displayGroup");
                                    if (bVar4) {
                                      name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                                      name_err._M_string_length = 0;
                                      name_err.field_2._M_local_buf[0] = '\0';
                                      bVar4 = ReadStringLiteral(this,&name_err);
                                      this_02 = (optional<std::__cxx11::string> *)
                                                &out_meta->displayGroup;
                                      if (bVar4) goto LAB_002982ee;
                                      ::std::__cxx11::ostringstream::ostringstream
                                                ((ostringstream *)&c);
                                      poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                      poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                      poVar9 = ::std::operator<<(poVar9,":");
                                      poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                      poVar9 = ::std::operator<<(poVar9,"():");
                                      poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd48);
                                      ::std::operator<<(poVar9," ");
                                      pcVar11 = "Failed to parse `displayGroup`(string type)";
                                    }
                                    else {
                                      bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"connectability");
                                      if (bVar4) {
                                        name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                                        name_err._M_string_length = 0;
                                        name_err.field_2._M_local_buf[0] = '\0';
                                        bVar4 = ReadBasicType(this,(token *)&name_err);
                                        this_01 = &out_meta->connectability;
                                        if (bVar4) {
LAB_002980e7:
                                          nonstd::optional_lite::optional<tinyusdz::Token>::
                                          operator=(this_01,(Token *)&name_err);
                                          goto LAB_00297e15;
                                        }
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)&c);
                                        poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                        poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                        poVar9 = ::std::operator<<(poVar9,":");
                                        poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                        poVar9 = ::std::operator<<(poVar9,"():");
                                        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd50)
                                        ;
                                        ::std::operator<<(poVar9," ");
                                        pcVar11 = "Failed to parse `connectability`";
                                      }
                                      else {
                                        bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"renderType");
                                        if (bVar4) {
                                          name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                                          name_err._M_string_length = 0;
                                          name_err.field_2._M_local_buf[0] = '\0';
                                          bVar4 = ReadBasicType(this,(token *)&name_err);
                                          this_01 = &out_meta->renderType;
                                          if (bVar4) goto LAB_002980e7;
                                          ::std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)&c);
                                          poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                          poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                          poVar9 = ::std::operator<<(poVar9,":");
                                          poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                          poVar9 = ::std::operator<<(poVar9,"():");
                                          poVar9 = (ostream *)
                                                   ::std::ostream::operator<<(poVar9,0xd57);
                                          ::std::operator<<(poVar9," ");
                                          pcVar11 = "Failed to parse `renderType`";
                                        }
                                        else {
                                          bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"outputName");
                                          if (!bVar4) {
                                            bVar4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&varname,"sdrMetadata");
                                            if (bVar4) {
                                              local_1e0 = (undefined1  [8])
                                                          ((ulong)local_1e0 & 0xffffffff00000000);
                                              local_1d8._0_8_ = (undefined **)0x0;
                                              local_1d8._8_8_ = local_1e0;
                                              local_1d8._16_2_ = (undefined2)local_1d8._8_8_;
                                              local_1d8._18_2_ =
                                                   (undefined2)((ulong)local_1d8._8_8_ >> 0x10);
                                              local_1d8._20_4_ =
                                                   (undefined4)((ulong)local_1d8._8_8_ >> 0x20);
                                              aaStack_1c0[0]._M_allocated_capacity._0_4_ = 0;
                                              aaStack_1c0[0]._M_allocated_capacity._4_4_ = 0;
                                              bVar4 = ParseDict(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)&c);
                                              if (!bVar4) {
                                                ::std::
                                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                ::~_Rb_tree((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)&c);
LAB_00297c72:
                                                cVar5 = true;
                                                goto LAB_00297a1f;
                                              }
                                              nonstd::optional_lite::
                                              optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                              ::operator=((
                                                  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                                  *)&out_meta->sdrMetadata,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)&c);
                                              ::std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                              ::~_Rb_tree((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)&c);
                                            }
                                            else {
                                              GetPropMetaDefinition
                                                        ((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&c,this,&varname);
                                              nonstd::optional_lite::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef,_0>
                                                        ((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&name_err,
                                                  (
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&c);
                                              nonstd::optional_lite::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                                              ~optional((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&c);
                                              if ((char)name_err._M_dataplus._M_p != '\x01') {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          ((ostringstream *)&c);
                                                poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                                poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                poVar9 = ::std::operator<<(poVar9,"[ASCII]");
                                                poVar9 = ::std::operator<<(poVar9,":");
                                                poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                                poVar9 = ::std::operator<<(poVar9,"():");
                                                poVar9 = (ostream *)
                                                         ::std::ostream::operator<<(poVar9,0xd7e);
                                                ::std::operator<<(poVar9," ");
                                                ::std::__cxx11::string::string
                                                          ((string *)local_70,
                                                                                                                      
                                                  "[InternalErrror] Failed to parse Property metadataum `{}`"
                                                  ,&local_2ea);
                                                fmt::format<std::__cxx11::string>
                                                          ((string *)&value_1,(fmt *)local_70,
                                                           (string *)&varname,args);
                                                poVar9 = ::std::operator<<((ostream *)&c,
                                                                           (string *)&value_1);
                                                ::std::operator<<(poVar9,"\n");
                                                ::std::__cxx11::string::_M_dispose();
                                                ::std::__cxx11::string::_M_dispose();
                                                ::std::__cxx11::stringbuf::str();
                                                PushError(this,(string *)&value_1);
                                                ::std::__cxx11::string::_M_dispose();
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          ((ostringstream *)&c);
                                                nonstd::optional_lite::
                                                optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                ::~optional((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&name_err);
                                                goto LAB_00297903;
                                              }
                                              local_1d8._0_8_ =
                                                   &linb::any::vtable_for_type<decltype(nullptr)>()
                                                    ::table;
                                              _c = (pointer)0x0;
                                              local_1d8._8_8_ = aaStack_1c0;
                                              local_1d8[0x10] = false;
                                              local_1d8[0x11] = false;
                                              local_1d8._18_2_ = 0;
                                              local_1d8._20_4_ = 0;
                                              aaStack_1c0[0]._M_allocated_capacity._0_4_ =
                                                   (undefined4)aaStack_1c0[0]._M_allocated_capacity
                                                   & 0xffffff00;
                                              def = nonstd::optional_lite::
                                                                                                        
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  ::value((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&name_err);
                                              bVar4 = ParseMetaValue(this,def,(MetaVariable *)&c);
                                              if (!bVar4) {
                                                MetaVariable::~MetaVariable((MetaVariable *)&c);
                                                nonstd::optional_lite::
                                                optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                ::~optional((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&name_err);
                                                goto LAB_00297c72;
                                              }
                                              ::std::__cxx11::string::_M_assign
                                                        ((string *)(local_1d8 + 8));
                                              pmVar8 = ::std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  ::operator[](this_00,&varname);
                                              MetaVariable::operator=(pmVar8,(MetaVariable *)&c);
                                              MetaVariable::~MetaVariable((MetaVariable *)&c);
                                              nonstd::optional_lite::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                                              ~optional((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)&name_err);
                                            }
                                            goto LAB_00297a97;
                                          }
                                          name_err._M_dataplus._M_p = (pointer)&name_err.field_2;
                                          name_err._M_string_length = 0;
                                          name_err.field_2._M_local_buf[0] = '\0';
                                          bVar4 = ReadBasicType(this,(token *)&name_err);
                                          this_01 = &out_meta->outputName;
                                          if (bVar4) goto LAB_002980e7;
                                          ::std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)&c);
                                          poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                          poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                          poVar9 = ::std::operator<<(poVar9,":");
                                          poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                          poVar9 = ::std::operator<<(poVar9,"():");
                                          poVar9 = (ostream *)
                                                   ::std::ostream::operator<<(poVar9,0xd5e);
                                          ::std::operator<<(poVar9," ");
                                          pcVar11 = "Failed to parse `outputName`";
                                        }
                                      }
                                    }
                                  }
                                }
                                poVar9 = ::std::operator<<((ostream *)&c,pcVar11);
                                ::std::operator<<(poVar9,"\n");
                                ::std::__cxx11::stringbuf::str();
                                PushError(this,(string *)&value_1);
                                ::std::__cxx11::string::_M_dispose();
                                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
                                goto LAB_00297e15;
                              }
                              bVar4 = ReadBasicType(this,(double *)&value_1);
                              if (!bVar4) {
                                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                                poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                                poVar9 = ::std::operator<<(poVar9,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                poVar9 = ::std::operator<<(poVar9,":");
                                poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                                poVar9 = ::std::operator<<(poVar9,"():");
                                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xd2b);
                                ::std::operator<<(poVar9," ");
                                poVar9 = ::std::operator<<((ostream *)&c,"Failed to parse `weight`")
                                ;
                                ::std::operator<<(poVar9,"\n");
                                ::std::__cxx11::stringbuf::str();
                                PushError(this,&name_err);
                                ::std::__cxx11::string::_M_dispose();
                                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
                                goto LAB_00297a1c;
                              }
                              c = 1;
                              local_1e0._4_4_ = uStack_4c;
                              local_1e0._0_4_ = value_1;
                              nonstd::optional_lite::optional<double>::operator=
                                        (&out_meta->weight,(optional<double> *)&c);
                            }
                          }
                        }
                      }
                    }
LAB_00297a97:
                    bVar4 = SkipWhitespaceAndNewline(this,true);
                    cVar5 = !bVar4;
                  }
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                poVar9 = ::std::operator<<((ostream *)&c,"[error]");
                poVar9 = ::std::operator<<(poVar9,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar9 = ::std::operator<<(poVar9,"[ASCII]");
                poVar9 = ::std::operator<<(poVar9,":");
                poVar9 = ::std::operator<<(poVar9,"ParseAttrMeta");
                poVar9 = ::std::operator<<(poVar9,"():");
                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xce8);
                ::std::operator<<(poVar9," ");
                ::std::__cxx11::string::string
                          ((string *)local_70,"Invalid Property name `{}`: {}",&local_2ea);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          ((string *)&value_1,(fmt *)local_70,&varname,&name_err,in_R8);
                poVar9 = ::std::operator<<((ostream *)&c,(string *)&value_1);
                ::std::operator<<(poVar9,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                PushError(this,(string *)&value_1);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
                ::std::__cxx11::string::_M_dispose();
LAB_00297a1c:
                cVar5 = true;
              }
            }
          }
LAB_00297a1f:
          ::std::__cxx11::string::_M_dispose();
        }
        if (cVar5 == '\x01') {
          return bVar3;
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseAttrMeta(AttrMeta *out_meta) {
  // '(' metas ')'
  //
  // currently we only support 'interpolation', 'elementSize' and 'cutomData'

  if (!SkipWhitespace()) {
    return false;
  }

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '(') {
      // ok
    } else {
      _sr->seek_from_current(-1);

      // Still ok. No meta
      DCOUT("No attribute meta.");
      return true;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ')') {
      // end meta
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      // May be string only
      {
        value::StringData sdata;
        if (MaybeTripleQuotedString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add triple-quoted string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        } else if (MaybeString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        }
      }

      std::string varname;
      if (!ReadIdentifier(&varname)) {
        return false;
      }

      DCOUT("Property/Attribute meta name: " << varname);

      bool supported = _supported_prop_metas.count(varname);
      if (!supported) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Unsupported Property metadatum name: {}", varname));
      }

      {
        std::string name_err;
        if (!pathutil::ValidatePropPath(Path("", varname), &name_err)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format("Invalid Property name `{}`: {}", varname, name_err));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      if (!Expect('=')) {
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      //
      // First-class predefind prop metas.
      //
      if (varname == "interpolation") {
        std::string value;
        if (!ReadStringLiteral(&value)) {
          return false;
        }

        DCOUT("Got `interpolation` meta : " << value);
        out_meta->interpolation = InterpolationFromString(value);
      } else if (varname == "elementSize") {
        uint32_t value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `elementSize`");
        }

        DCOUT("Got `elementSize` meta : " << value);
        out_meta->elementSize = value;
      } else if (varname == "colorSpace") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `colorSpace`");
        }
        // Add as custom meta value.
        MetaVariable metavar;
        metavar.set_value("colorSpace", tok);
        out_meta->meta["colorSpace"] = metavar;
      } else if (varname == "unauthoredValuesIndex") {
        int value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `unauthoredValuesIndex`");
        }

        DCOUT("Got `unauthoredValuesIndex` meta : " << value);
        MetaVariable metavar;
        metavar.set_value("unauthoredValuesIndex", value);
        out_meta->meta["unauthoredValuesIndex"] = metavar;
      } else if (varname == "customData") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        DCOUT("Got `customData` meta");
        out_meta->customData = dict;

      } else if (varname == "weight") {
        double value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `weight`");
        }

        DCOUT("Got `weight` meta : " << value);
        out_meta->weight = value;
      } else if (varname == "bindMaterialAs") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `bindMaterialAs`");
        }
        if ((tok.str() == kWeaderThanDescendants) ||
            (tok.str() == kStrongerThanDescendants)) {
          // ok
        } else {
          // still valid though
          PUSH_WARN("Unsupported token for bindMaterialAs: " << tok.str());
        }
        DCOUT("bindMaterialAs: " << tok);
        out_meta->bindMaterialAs = tok;
      } else if (varname == "displayName") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayName`(string type)");
        }
        DCOUT("displayName: " << str);
        out_meta->displayName = str;
      } else if (varname == "displayGroup") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayGroup`(string type)");
        }
        DCOUT("displayGroup: " << str);
        out_meta->displayGroup = str;

      } else if (varname == "connectability") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `connectability`");
        }
        DCOUT("connectability: " << tok);
        out_meta->connectability = tok;
      } else if (varname == "renderType") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `renderType`");
        }
        DCOUT("renderType: " << tok);
        out_meta->renderType = tok;
      } else if (varname == "outputName") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `outputName`");
        }
        DCOUT("outputName: " << tok);
        out_meta->outputName = tok;
      } else if (varname == "sdrMetadata") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        out_meta->sdrMetadata = dict;
      } else {
        if (auto pv = GetPropMetaDefinition(varname)) {
          // Parse as generic metadata variable
          MetaVariable metavar;
          const auto &vardef = pv.value();

          if (!ParseMetaValue(vardef, &metavar)) {
            return false;
          }
          metavar.set_name(varname);

          // add to custom meta
          out_meta->meta[varname] = metavar;

        } else {
          // This should not happen though.
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format(
                  "[InternalErrror] Failed to parse Property metadataum `{}`",
                  varname));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  return true;
}